

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* soplex::
  LPFreadValue<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (char **pos,SPxOut *spxout)

{
  bool bVar1;
  int iVar2;
  Verbosity VVar3;
  char *pcVar4;
  SPxOut *in_RDX;
  long *in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  Verbosity old_verbosity;
  bool has_emptyexponent;
  bool has_digits;
  char *t;
  char *s;
  char tmp [8192];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *value;
  char *in_stack_ffffffffffffdf38;
  SPxOut *in_stack_ffffffffffffdf40;
  undefined5 in_stack_ffffffffffffdf48;
  undefined1 in_stack_ffffffffffffdf4d;
  undefined1 in_stack_ffffffffffffdf4e;
  undefined1 in_stack_ffffffffffffdf4f;
  cpp_dec_float<200U,_int,_void> *args_1;
  undefined4 local_208c;
  Verbosity local_2088;
  byte local_2082;
  byte local_2081;
  undefined8 local_2080;
  char *local_2078;
  char *local_2070;
  char local_2068 [184];
  double in_stack_ffffffffffffe050;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe058;
  
  local_2070 = (char *)*in_RSI;
  local_2080 = 0x3ff0000000000000;
  args_1 = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_RDI,(double)CONCAT17(in_stack_ffffffffffffdf4f,
                                     CONCAT16(in_stack_ffffffffffffdf4e,
                                              CONCAT15(in_stack_ffffffffffffdf4d,
                                                       in_stack_ffffffffffffdf48))),
             in_stack_ffffffffffffdf40);
  local_2081 = 0;
  local_2082 = 0;
  if ((*local_2070 == '+') || (*local_2070 == '-')) {
    local_2070 = local_2070 + 1;
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *local_2070) {
      bVar1 = *local_2070 < ':';
    }
    if (!bVar1) break;
    local_2081 = 1;
    local_2070 = local_2070 + 1;
  }
  if (*local_2070 == '.') {
    while( true ) {
      local_2070 = local_2070 + 1;
      bVar1 = false;
      if ('/' < *local_2070) {
        bVar1 = *local_2070 < ':';
      }
      if (!bVar1) break;
      local_2081 = 1;
    }
  }
  iVar2 = tolower((int)*local_2070);
  if (iVar2 == 0x65) {
    local_2082 = 1;
    pcVar4 = local_2070 + 1;
    if ((*pcVar4 == '+') || (*pcVar4 == '-')) {
      pcVar4 = local_2070 + 2;
    }
    while( true ) {
      local_2070 = pcVar4;
      bVar1 = false;
      if ('/' < *local_2070) {
        bVar1 = *local_2070 < ':';
      }
      if (!bVar1) break;
      local_2082 = 0;
      pcVar4 = local_2070 + 1;
    }
  }
  if ((((local_2082 & 1) != 0) && (in_RDX != (SPxOut *)0x0)) &&
     (VVar3 = SPxOut::getVerbosity(in_RDX), 0 < (int)VVar3)) {
    local_2088 = SPxOut::getVerbosity(in_RDX);
    local_208c = 1;
    (*in_RDX->_vptr_SPxOut[2])(in_RDX,&local_208c);
    operator<<(in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38);
    (*in_RDX->_vptr_SPxOut[2])(in_RDX,&local_2088);
  }
  if ((local_2081 & 1) == 0) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffe058,in_stack_ffffffffffffe050);
  }
  else {
    local_2078 = local_2068;
    while ((char *)*in_RSI != local_2070) {
      *local_2078 = *(char *)*in_RSI;
      *in_RSI = *in_RSI + 1;
      local_2078 = local_2078 + 1;
    }
    *local_2078 = '\0';
    atof(local_2068);
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffe058,in_stack_ffffffffffffe050);
  }
  *in_RSI = (long)(local_2070 + (*in_RSI - *in_RSI));
  SPxOut::
  debug<soplex::SPxOut,_const_char_(&)[28],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
            (in_RDX,(char (*) [28])"DLPFRD01 LPFreadValue = {}\n",
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)args_1);
  bVar1 = LPFisSpace((int)*(char *)*in_RSI);
  if (bVar1) {
    *in_RSI = *in_RSI + 1;
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

static R LPFreadValue(char*& pos, SPxOut* spxout)
{
   assert(LPFisValue(pos));

   char        tmp[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   char*       t;
   R        value = 1.0;
   bool        has_digits = false;
   bool        has_emptyexponent = false;

   // 1. sign
   if((*s == '+') || (*s == '-'))
      s++;

   // 2. Digits before the decimal dot
   while((*s >= '0') && (*s <= '9'))
   {
      has_digits = true;
      s++;
   }

   // 3. Decimal dot
   if(*s == '.')
   {
      s++;

      // 4. If there was a dot, possible digit behind it
      while((*s >= '0') && (*s <= '9'))
      {
         has_digits = true;
         s++;
      }
   }

   // 5. Exponent
   if(tolower(*s) == 'e')
   {
      has_emptyexponent = true;
      s++;

      // 6. Exponent sign
      if((*s == '+') || (*s == '-'))
         s++;

      // 7. Exponent digits
      while((*s >= '0') && (*s <= '9'))
      {
         has_emptyexponent = false;
         s++;
      }
   }

   assert(s != pos);

   if(has_emptyexponent)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "WLPFRD01 Warning: found empty exponent in LP file - check for forbidden variable names with initial 'e' or 'E'\n";
                     )
   }

   if(!has_digits)
      value = (*pos == '-') ? -1.0 : 1.0;
   else
   {
      for(t = tmp; pos != s; pos++)
         *t++ = *pos;

      *t = '\0';
      value = atof(tmp);
   }

   pos += s - pos;

   assert(pos == s);

   SPxOut::debug(spxout, "DLPFRD01 LPFreadValue = {}\n", value);

   if(LPFisSpace(*pos))
      pos++;

   return value;
}